

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDeriveFromBdd(void *dd0,void *bFunc,char *pNamePo,Vec_Ptr_t *vNamesPi)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  char *s;
  Vec_Ptr_t *vNames;
  
  s = "F";
  if (pNamePo != (char *)0x0) {
    s = pNamePo;
  }
  if (vNamesPi == (Vec_Ptr_t *)0x0) {
    vNamesPi = Abc_NodeGetFakeNames(*(int *)((long)dd0 + 0x88));
    vNames = vNamesPi;
  }
  else {
    vNames = (Vec_Ptr_t *)0x0;
  }
  pDVar2 = Cudd_Support((DdManager *)dd0,(DdNode *)bFunc);
  Cudd_Ref(pDVar2);
  pDVar6 = pDVar2;
  while( true ) {
    pDVar3 = Cudd_ReadOne((DdManager *)dd0);
    if (pDVar6 == pDVar3) break;
    uVar1 = Cudd_NodeReadIndex(pDVar6);
    if (vNamesPi->nSize <= (int)uVar1) break;
    pDVar6 = (pDVar6->type).kids.T;
  }
  Cudd_RecursiveDeref((DdManager *)dd0,pDVar2);
  pDVar2 = Cudd_ReadOne((DdManager *)dd0);
  iVar8 = 0;
  if (pDVar6 == pDVar2) {
    pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
    pcVar4 = Extra_UtilStrsav(s);
    pNtk->pName = pcVar4;
    Cudd_bddIthVar((DdManager *)pNtk->pManFunc,vNamesPi->nSize);
    for (; iVar8 < vNamesPi->nSize; iVar8 = iVar8 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(vNamesPi,iVar8);
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      Abc_ObjAssignName(pAVar5,pcVar4,(char *)0x0);
    }
    pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    pDVar6 = Cudd_bddTransfer((DdManager *)dd0,(DdManager *)pNtk->pManFunc,(DdNode *)bFunc);
    (pAVar5->field_5).pData = pDVar6;
    Cudd_Ref(pDVar6);
    for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar8);
      Abc_ObjAddFanin(pAVar5,pAVar7);
    }
    pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
    Abc_ObjAddFanin(pAVar7,pAVar5);
    Abc_ObjAssignName(pAVar7,s,(char *)0x0);
    Abc_NtkMinimumBase(pNtk);
    if (vNames != (Vec_Ptr_t *)0x0) {
      Abc_NodeFreeNames(vNames);
    }
    iVar8 = Abc_NtkCheck(pNtk);
    if (iVar8 == 0) {
      fwrite("Abc_NtkDeriveFromBdd(): Network check has failed.\n",0x32,1,_stdout);
    }
  }
  else {
    pNtk = (Abc_Ntk_t *)0x0;
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveFromBdd( void * dd0, void * bFunc, char * pNamePo, Vec_Ptr_t * vNamesPi )
{
    DdManager * dd = (DdManager *)dd0;
    Abc_Ntk_t * pNtk; 
    Vec_Ptr_t * vNamesPiFake = NULL;
    Abc_Obj_t * pNode, * pNodePi, * pNodePo;
    DdNode * bSupp, * bTemp;
    char * pName;
    int i;

    // supply fake names if real names are not given
    if ( pNamePo == NULL )
        pNamePo = "F";
    if ( vNamesPi == NULL )
    {
        vNamesPiFake = Abc_NodeGetFakeNames( dd->size );
        vNamesPi = vNamesPiFake;
    }

    // make sure BDD depends on the variables whose index 
    // does not exceed the size of the array with PI names
    bSupp = Cudd_Support( dd, (DdNode *)bFunc );   Cudd_Ref( bSupp );
    for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
        if ( (int)Cudd_NodeReadIndex(bTemp) >= Vec_PtrSize(vNamesPi) )
            break;
    Cudd_RecursiveDeref( dd, bSupp );
    if ( bTemp != Cudd_ReadOne(dd) )
        return NULL;

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    pNtk->pName = Extra_UtilStrsav(pNamePo);
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtk->pManFunc, Vec_PtrSize(vNamesPi) );
    // add the PIs corresponding to the names
    Vec_PtrForEachEntry( char *, vNamesPi, pName, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), pName, NULL );
    // create the node
    pNode = Abc_NtkCreateNode( pNtk );
    pNode->pData = (DdNode *)Cudd_bddTransfer( dd, (DdManager *)pNtk->pManFunc, (DdNode *)bFunc ); Cudd_Ref((DdNode *)pNode->pData);
    Abc_NtkForEachPi( pNtk, pNodePi, i )
        Abc_ObjAddFanin( pNode, pNodePi );
    // create the only PO
    pNodePo = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNodePo, pNode );
    Abc_ObjAssignName( pNodePo, pNamePo, NULL );
    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );
    if ( vNamesPiFake )
        Abc_NodeFreeNames( vNamesPiFake );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkDeriveFromBdd(): Network check has failed.\n" );
    return pNtk;
}